

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O1

Vec3<float> __thiscall Imath_2_5::Vec3<float>::normalized(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec3<float> *in_RSI;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vec3<float> VVar8;
  
  fVar4 = 0.0;
  fVar3 = in_RSI->z * in_RSI->z + in_RSI->x * in_RSI->x + in_RSI->y * in_RSI->y;
  if (2.3509887e-38 <= fVar3) {
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
      fVar4 = extraout_XMM0_Db_00;
    }
    else {
      fVar3 = SQRT(fVar3);
    }
  }
  else {
    fVar3 = lengthTiny(in_RSI);
    fVar4 = extraout_XMM0_Db;
  }
  fVar5 = 0.0;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar5 = in_RSI->z / fVar3;
    uVar1 = in_RSI->x;
    uVar2 = in_RSI->y;
    auVar6._4_4_ = uVar2;
    auVar6._0_4_ = uVar1;
    auVar6._8_8_ = 0;
    auVar7._4_4_ = fVar3;
    auVar7._0_4_ = fVar3;
    auVar7._8_4_ = fVar4;
    auVar7._12_4_ = fVar4;
    auVar7 = divps(auVar6,auVar7);
    this->x = (float)(int)auVar7._0_8_;
    this->y = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
    this->z = fVar5;
    fVar4 = fVar3;
  }
  else {
    this->z = 0.0;
    this->x = 0.0;
    this->y = 0.0;
  }
  VVar8.y = fVar4;
  VVar8.x = fVar3;
  VVar8.z = fVar5;
  return VVar8;
}

Assistant:

Vec3<T>
Vec3<T>::normalized () const
{
    T l = length();

    if (l == T (0))
	return Vec3 (T (0));

    return Vec3 (x / l, y / l, z / l);
}